

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::ChooseRenderPassAndFramebuffer(DeviceContextVkImpl *this)

{
  RefCntAutoPtr<Diligent::ITextureView> *this_00;
  uint uVar1;
  ITexture *pIVar2;
  RenderDeviceVkImpl *pRVar3;
  FramebufferCache *this_01;
  RenderPassCache *this_02;
  ITextureView *pIVar4;
  RenderingInfoWrapper *pRVar5;
  _Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false> __ptr;
  uint uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TextureViewVkImpl *pTVar9;
  RenderPassVkImpl *pRVar10;
  VkFramebuffer pVVar11;
  undefined4 extraout_var_03;
  TextureFormatAttribs *pTVar12;
  undefined4 extraout_var_04;
  long lVar13;
  unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  *this_03;
  byte bVar14;
  ulong uVar15;
  bool bVar16;
  string msg;
  undefined1 local_108 [16];
  undefined1 local_f8 [17];
  byte bStack_e7;
  bool bStack_e6;
  undefined5 uStack_e5;
  undefined2 auStack_e2 [5];
  undefined6 uStack_d8;
  size_type local_d0;
  CreateDyanmicRenderInfoAttribs local_c0;
  FramebufferCacheKey local_a0;
  
  local_a0.Pass = (VkRenderPass)0x0;
  local_a0.RTVs[0] = (VkImageView)0x0;
  local_a0.RTVs[1] = (VkImageView)0x0;
  local_a0.RTVs[2] = (VkImageView)0x0;
  local_a0.RTVs[3] = (VkImageView)0x0;
  local_a0.RTVs[4] = (VkImageView)0x0;
  local_a0.RTVs[5] = (VkImageView)0x0;
  local_a0.RTVs[6] = (VkImageView)0x0;
  local_a0.RTVs[7] = (VkImageView)0x0;
  local_a0.ShadingRate = (VkImageView)0x0;
  local_a0.CommandQueueMask = 0;
  local_a0.Hash = 0;
  local_d0 = 0;
  _bStack_e7 = 0;
  auStack_e2[1] = 0;
  auStack_e2[2] = 0;
  auStack_e2[3] = 0;
  auStack_e2[4] = 0;
  uStack_d8 = 0;
  pTVar9 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
  if (pTVar9 == (TextureViewVkImpl *)0x0) {
    local_a0.DSV = (VkImageView_T *)0x0;
    bVar14 = 0;
  }
  else {
    local_a0.DSV = (pTVar9->m_ImageView).m_VkObject;
    stack0xffffffffffffff18 =
         (ulong)CONCAT21((pTVar9->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                         .m_Desc.Format,
                         (pTVar9->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                         .m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL) << 0x18;
    iVar8 = (*(((pTVar9->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
              super_IDeviceObject).super_IObject._vptr_IObject[4])();
    bVar14 = *(byte *)(CONCAT44(extraout_var,iVar8) + 0x20);
    _bStack_e7 = CONCAT61(_bStack_e6,bVar14);
  }
  local_a0.NumRenderTargets =
       (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
  local_f8[0x10] = (char)local_a0.NumRenderTargets;
  if (local_a0.NumRenderTargets != 0) {
    uVar15 = 0;
    do {
      pTVar9 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundRenderTargets[uVar15].
               m_pObject;
      if (pTVar9 == (TextureViewVkImpl *)0x0) {
        local_a0.RTVs[uVar15] = (VkImageView)0x0;
        ((undefined2 *)((long)register0x00000020 + -0xe2))[uVar15] = 0;
      }
      else {
        pIVar2 = (pTVar9->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture;
        local_a0.RTVs[uVar15] = (pTVar9->m_ImageView).m_VkObject;
        iVar8 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
        ((undefined2 *)((long)register0x00000020 + -0xe2))[uVar15] =
             *(undefined2 *)(CONCAT44(extraout_var_00,iVar8) + 0x18);
        if (bVar14 == 0) {
          iVar8 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
          bVar14 = *(byte *)(CONCAT44(extraout_var_02,iVar8) + 0x20);
          bStack_e7 = bVar14;
        }
        else {
          iVar8 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
          if (*(uint *)(CONCAT44(extraout_var_01,iVar8) + 0x20) != (uint)bVar14) {
            FormatString<char[26]>((string *)local_108,(char (*) [26])"Inconsistent sample count");
            DebugAssertionFailed
                      ((Char *)local_108._0_8_,"ChooseRenderPassAndFramebuffer",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x767);
            if ((RenderingInfoWrapper *)local_108._0_8_ !=
                (RenderingInfoWrapper *)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
            }
          }
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets)
    ;
  }
  if (bVar14 == 0) {
    bStack_e7 = (char)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSamples;
  }
  this_00 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap;
  bVar16 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap.m_pObject ==
           (ITextureView *)0x0;
  if (bVar16) {
    local_a0.ShadingRate = (VkImageView_T *)0x0;
  }
  else {
    pTVar9 = RefCntAutoPtr<Diligent::ITextureView>::RawPtr<Diligent::TextureViewVkImpl>(this_00);
    local_a0.ShadingRate = (pTVar9->m_ImageView).m_VkObject;
  }
  bStack_e6 = !bVar16;
  pRVar3 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  this_01 = (pRVar3->m_FramebufferCache)._M_t.
            super___uniq_ptr_impl<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::FramebufferCache_*,_std::default_delete<Diligent::FramebufferCache>_>
            .super__Head_base<0UL,_Diligent::FramebufferCache_*,_false>._M_head_impl;
  this_02 = (pRVar3->m_ImplicitRenderPassCache)._M_t.
            super___uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::RenderPassCache_*,_std::default_delete<Diligent::RenderPassCache>_>
            .super__Head_base<0UL,_Diligent::RenderPassCache_*,_false>._M_head_impl;
  if (this_02 == (RenderPassCache *)0x0 || this_01 == (FramebufferCache *)0x0) {
    local_c0.UseDepthAttachment = false;
    local_c0.UseStencilAttachment = false;
    local_c0.ReadOnlyDepthStencil = false;
    local_c0.ShadingRateTexelSize.width = 0;
    local_c0.ShadingRateTexelSize.height = 0;
    local_c0.Extent.width =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth;
    local_c0.Extent.height =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight;
    local_c0.Layers =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSlices;
    local_c0.ViewMask = 0;
    pTVar9 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
    bVar16 = pTVar9 != (TextureViewVkImpl *)0x0;
    if (bVar16) {
      iVar8 = (*(((pTVar9->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
                super_IDeviceObject).super_IObject._vptr_IObject[4])();
      pTVar12 = GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(CONCAT44(extraout_var_03,iVar8) + 0x18))
      ;
      local_c0.UseStencilAttachment = pTVar12->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;
      local_c0.ReadOnlyDepthStencil =
           (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject)->
           super_TextureViewBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
           .m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
    }
    pIVar4 = this_00->m_pObject;
    local_c0.UseDepthAttachment = bVar16;
    if (pIVar4 != (ITextureView *)0x0) {
      iVar8 = (*(pIVar4->super_IDeviceObject).super_IObject._vptr_IObject[10])();
      lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar8) + 0x20))();
      uVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth;
      uVar6 = uVar1 / *(uint *)(lVar13 + 0xc);
      local_c0.ShadingRateTexelSize.width = 0;
      if ((*(uint *)(lVar13 + 0xc) <= uVar1) &&
         (local_c0.ShadingRateTexelSize.width = uVar6, (uVar6 & uVar6 - 1) != 0)) {
        iVar8 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        local_c0.ShadingRateTexelSize.width = 1 << (-((byte)iVar8 ^ 0x1f) & 0x1f);
      }
      uVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight;
      uVar6 = uVar1 / *(uint *)(lVar13 + 0x10);
      local_c0.ShadingRateTexelSize.height = 0;
      if ((*(uint *)(lVar13 + 0x10) <= uVar1) &&
         (local_c0.ShadingRateTexelSize.height = uVar6, (uVar6 & uVar6 - 1) != 0)) {
        iVar8 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        local_c0.ShadingRateTexelSize.height = 1 << (-((byte)iVar8 ^ 0x1f) & 0x1f);
      }
    }
    pRVar5 = (this->m_DynamicRenderingInfo)._M_t.
             super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl;
    if ((pRVar5 != (RenderingInfoWrapper *)0x0) && (pRVar5->m_AttachmentClearMask != 0)) {
      FormatString<char[52]>
                ((string *)local_108,
                 (char (*) [52])"There are pending clears in the dynamic render pass");
      DebugAssertionFailed
                ((Char *)local_108._0_8_,"ChooseRenderPassAndFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x7aa);
      if ((RenderingInfoWrapper *)local_108._0_8_ != (RenderingInfoWrapper *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
      }
    }
    this_03 = &this->m_DynamicRenderingInfo;
    FramebufferCache::CreateDyanmicRenderInfo((FramebufferCache *)local_108,&local_a0,&local_c0);
    uVar7 = local_108._0_8_;
    local_108._0_8_ = (RenderingInfoWrapper *)0x0;
    __ptr._M_head_impl =
         (this_03->_M_t).
         super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
         ._M_t.
         super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
         .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl;
    (this_03->_M_t).
    super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
    ._M_t.
    super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
    .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl =
         (RenderingInfoWrapper *)uVar7;
    if ((__ptr._M_head_impl != (RenderingInfoWrapper *)0x0) &&
       (std::default_delete<VulkanUtilities::RenderingInfoWrapper>::operator()
                  ((default_delete<VulkanUtilities::RenderingInfoWrapper> *)this_03,
                   __ptr._M_head_impl),
       (RenderingInfoWrapper *)local_108._0_8_ != (RenderingInfoWrapper *)0x0)) {
      std::default_delete<VulkanUtilities::RenderingInfoWrapper>::operator()
                ((default_delete<VulkanUtilities::RenderingInfoWrapper> *)local_108,
                 (RenderingInfoWrapper *)local_108._0_8_);
    }
  }
  else {
    pRVar10 = RenderPassCache::GetRenderPass(this_02,(RenderPassCacheKey *)(local_f8 + 0x10));
    if (pRVar10 == (RenderPassVkImpl *)0x0) {
      FormatString<char[65]>
                ((string *)local_108,
                 (char (*) [65])"Unable to get render pass for the currently bound render targets");
      DebugAssertionFailed
                ((Char *)local_108._0_8_,"ChooseRenderPassAndFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x78b);
      if ((RenderingInfoWrapper *)local_108._0_8_ != (RenderingInfoWrapper *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
      }
      this->m_vkRenderPass = (VkRenderPass)0x0;
      this->m_vkFramebuffer = (VkFramebuffer)0x0;
    }
    else {
      local_a0.Pass = (pRVar10->m_VkRenderPass).m_VkObject;
      this->m_vkRenderPass = local_a0.Pass;
      local_a0.CommandQueueMask = 0xffffffffffffffff;
      pVVar11 = FramebufferCache::GetFramebuffer
                          (this_01,&local_a0,
                           (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth,
                           (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight
                           ,(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                            m_FramebufferSlices);
      this->m_vkFramebuffer = pVVar11;
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::ChooseRenderPassAndFramebuffer()
{
    FramebufferCache::FramebufferCacheKey FBKey;
    RenderPassCache::RenderPassCacheKey   RenderPassKey;
    if (m_pBoundDepthStencil)
    {
        ITexture* pDepthBuffer    = m_pBoundDepthStencil->GetTexture();
        FBKey.DSV                 = m_pBoundDepthStencil->GetVulkanImageView();
        RenderPassKey.DSVFormat   = m_pBoundDepthStencil->GetDesc().Format;
        RenderPassKey.ReadOnlyDSV = m_pBoundDepthStencil->GetDesc().ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
        RenderPassKey.SampleCount = static_cast<Uint8>(pDepthBuffer->GetDesc().SampleCount);
    }
    else
    {
        FBKey.DSV               = VK_NULL_HANDLE;
        RenderPassKey.DSVFormat = TEX_FORMAT_UNKNOWN;
    }

    FBKey.NumRenderTargets         = m_NumBoundRenderTargets;
    RenderPassKey.NumRenderTargets = static_cast<Uint8>(m_NumBoundRenderTargets);

    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        if (TextureViewVkImpl* pRTVVk = m_pBoundRenderTargets[rt])
        {
            ITexture* pRenderTarget      = pRTVVk->GetTexture();
            FBKey.RTVs[rt]               = pRTVVk->GetVulkanImageView();
            RenderPassKey.RTVFormats[rt] = pRenderTarget->GetDesc().Format;
            if (RenderPassKey.SampleCount == 0)
                RenderPassKey.SampleCount = static_cast<Uint8>(pRenderTarget->GetDesc().SampleCount);
            else
                VERIFY(RenderPassKey.SampleCount == pRenderTarget->GetDesc().SampleCount, "Inconsistent sample count");
        }
        else
        {
            FBKey.RTVs[rt]               = VK_NULL_HANDLE;
            RenderPassKey.RTVFormats[rt] = TEX_FORMAT_UNKNOWN;
        }
    }

    if (RenderPassKey.SampleCount == 0)
        RenderPassKey.SampleCount = static_cast<Uint8>(m_FramebufferSamples);

    if (m_pBoundShadingRateMap)
    {
        FBKey.ShadingRate       = m_pBoundShadingRateMap.RawPtr<TextureViewVkImpl>()->GetVulkanImageView();
        RenderPassKey.EnableVRS = true;
    }
    else
    {
        FBKey.ShadingRate       = VK_NULL_HANDLE;
        RenderPassKey.EnableVRS = false;
    }

    FramebufferCache* FBCache = m_pDevice->GetFramebufferCache();
    RenderPassCache*  RPCache = m_pDevice->GetImplicitRenderPassCache();
    if (FBCache != nullptr && RPCache != nullptr)
    {
        if (RenderPassVkImpl* pRenderPass = RPCache->GetRenderPass(RenderPassKey))
        {
            m_vkRenderPass         = pRenderPass->GetVkRenderPass();
            FBKey.Pass             = m_vkRenderPass;
            FBKey.CommandQueueMask = ~Uint64{0};
            m_vkFramebuffer        = FBCache->GetFramebuffer(FBKey, m_FramebufferWidth, m_FramebufferHeight, m_FramebufferSlices);
        }
        else
        {
            UNEXPECTED("Unable to get render pass for the currently bound render targets");
            m_vkRenderPass  = VK_NULL_HANDLE;
            m_vkFramebuffer = VK_NULL_HANDLE;
        }
    }
    else
    {
        FramebufferCache::CreateDyanmicRenderInfoAttribs CreateRIAttribs;
        CreateRIAttribs.Extent   = {m_FramebufferWidth, m_FramebufferHeight};
        CreateRIAttribs.Layers   = m_FramebufferSlices;
        CreateRIAttribs.ViewMask = 0;
        if (m_pBoundDepthStencil)
        {
            const TEXTURE_FORMAT        DepthStencilFmt = m_pBoundDepthStencil->GetTexture()->GetDesc().Format;
            const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(DepthStencilFmt);

            CreateRIAttribs.UseDepthAttachment   = true;
            CreateRIAttribs.UseStencilAttachment = FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;
            CreateRIAttribs.ReadOnlyDepthStencil = (m_pBoundDepthStencil->GetDesc().ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
        }
        if (m_pBoundShadingRateMap)
        {
            const TextureDesc& ShadingRateDesc = m_pBoundShadingRateMap->GetTexture()->GetDesc();
            // Framebuffer size may not be an integer multiple of the shading rate texel size
            // Shading rate texel size be a power of two
            //   https://registry.khronos.org/vulkan/specs/latest/man/html/VkRenderingFragmentShadingRateAttachmentInfoKHR.html#VUID-VkRenderingFragmentShadingRateAttachmentInfoKHR-imageView-06149
            //   https://registry.khronos.org/vulkan/specs/latest/man/html/VkRenderingFragmentShadingRateAttachmentInfoKHR.html#VUID-VkRenderingFragmentShadingRateAttachmentInfoKHR-imageView-06152
            CreateRIAttribs.ShadingRateTexelSize.width  = AlignUpToPowerOfTwo(m_FramebufferWidth / ShadingRateDesc.Width);
            CreateRIAttribs.ShadingRateTexelSize.height = AlignUpToPowerOfTwo(m_FramebufferHeight / ShadingRateDesc.Height);
        }

        VERIFY(!m_DynamicRenderingInfo || !m_DynamicRenderingInfo->HasClears(), "There are pending clears in the dynamic render pass");
        m_DynamicRenderingInfo = FramebufferCache::CreateDyanmicRenderInfo(FBKey, CreateRIAttribs);
    }
}